

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree-dense-points.cpp
# Opt level: O0

ContinuousBounds * compute_bounds(vector<PointT,_std::allocator<PointT>_> *points)

{
  bool bVar1;
  reference pvVar2;
  float *pfVar3;
  reference pfVar4;
  reference pPVar5;
  vector<PointT,_std::allocator<PointT>_> *in_RSI;
  ContinuousBounds *in_RDI;
  float fVar6;
  PointT pt;
  iterator __end1;
  iterator __begin1;
  vector<PointT,_std::allocator<PointT>_> *__range1;
  ContinuousBounds *bds;
  vector<PointT,_std::allocator<PointT>_> *in_stack_fffffffffffffe38;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  Bounds<float> *in_stack_fffffffffffffe50;
  PointT local_50;
  PointT *local_40;
  __normal_iterator<PointT_*,_std::vector<PointT,_std::allocator<PointT>_>_> local_38 [4];
  undefined1 local_11;
  
  local_11 = 0;
  diy::Bounds<float>::Bounds(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  pvVar2 = std::vector<PointT,_std::allocator<PointT>_>::operator[](in_RSI,0);
  pfVar3 = PointT::operator[](pvVar2,0);
  fVar6 = *pfVar3;
  pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
  *pfVar4 = fVar6;
  pvVar2 = std::vector<PointT,_std::allocator<PointT>_>::operator[](in_RSI,0);
  pfVar3 = PointT::operator[](pvVar2,1);
  fVar6 = *pfVar3;
  pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
  *pfVar4 = fVar6;
  pvVar2 = std::vector<PointT,_std::allocator<PointT>_>::operator[](in_RSI,0);
  pfVar3 = PointT::operator[](pvVar2,2);
  fVar6 = *pfVar3;
  pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
  *pfVar4 = fVar6;
  pvVar2 = std::vector<PointT,_std::allocator<PointT>_>::operator[](in_RSI,0);
  pfVar3 = PointT::operator[](pvVar2,0);
  fVar6 = *pfVar3;
  pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
  *pfVar4 = fVar6;
  pvVar2 = std::vector<PointT,_std::allocator<PointT>_>::operator[](in_RSI,0);
  pfVar3 = PointT::operator[](pvVar2,1);
  fVar6 = *pfVar3;
  pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
  *pfVar4 = fVar6;
  pvVar2 = std::vector<PointT,_std::allocator<PointT>_>::operator[](in_RSI,0);
  pfVar3 = PointT::operator[](pvVar2,2);
  fVar6 = *pfVar3;
  pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
  *pfVar4 = fVar6;
  local_38[0]._M_current =
       (PointT *)std::vector<PointT,_std::allocator<PointT>_>::begin(in_stack_fffffffffffffe38);
  local_40 = (PointT *)std::vector<PointT,_std::allocator<PointT>_>::end(in_stack_fffffffffffffe38);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<PointT_*,_std::vector<PointT,_std::allocator<PointT>_>_>
                             *)in_stack_fffffffffffffe40,
                            (__normal_iterator<PointT_*,_std::vector<PointT,_std::allocator<PointT>_>_>
                             *)in_stack_fffffffffffffe38), bVar1) {
    pPVar5 = __gnu_cxx::__normal_iterator<PointT_*,_std::vector<PointT,_std::allocator<PointT>_>_>::
             operator*(local_38);
    local_50.coords[2] = pPVar5->coords[2];
    local_50.coords._0_8_ = *(undefined8 *)pPVar5->coords;
    fVar6 = PointT::operator[](&local_50,0);
    pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
    if (fVar6 < *pfVar4) {
      fVar6 = PointT::operator[](&local_50,0);
      pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
      *pfVar4 = fVar6;
    }
    fVar6 = PointT::operator[](&local_50,1);
    pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
    if (fVar6 < *pfVar4) {
      fVar6 = PointT::operator[](&local_50,1);
      pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
      *pfVar4 = fVar6;
    }
    fVar6 = PointT::operator[](&local_50,2);
    pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
    if (fVar6 < *pfVar4) {
      fVar6 = PointT::operator[](&local_50,2);
      pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
      *pfVar4 = fVar6;
    }
    fVar6 = PointT::operator[](&local_50,0);
    pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
    if (*pfVar4 <= fVar6 && fVar6 != *pfVar4) {
      fVar6 = PointT::operator[](&local_50,0);
      pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
      *pfVar4 = fVar6;
    }
    fVar6 = PointT::operator[](&local_50,1);
    pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
    if (*pfVar4 <= fVar6 && fVar6 != *pfVar4) {
      fVar6 = PointT::operator[](&local_50,1);
      pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
      *pfVar4 = fVar6;
    }
    fVar6 = PointT::operator[](&local_50,2);
    pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
    if (*pfVar4 <= fVar6 && fVar6 != *pfVar4) {
      fVar6 = PointT::operator[](&local_50,2);
      in_stack_fffffffffffffe40 =
           (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
           itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
      *(float *)in_stack_fffffffffffffe40 = fVar6;
    }
    __gnu_cxx::__normal_iterator<PointT_*,_std::vector<PointT,_std::allocator<PointT>_>_>::
    operator++(local_38);
  }
  return in_RDI;
}

Assistant:

diy::ContinuousBounds compute_bounds(std::vector<PointT> points)
{
  diy::ContinuousBounds bds(3);
  bds.min[kd_x] = points[0][kd_x];
  bds.min[kd_y] = points[0][kd_y];
  bds.min[kd_z] = points[0][kd_z];
  bds.max[kd_x] = points[0][kd_x];
  bds.max[kd_y] = points[0][kd_y];
  bds.max[kd_z] = points[0][kd_z];
  // just need to find min and max of each coordinate axis
  for (const auto pt : points)
  {
    if (pt[kd_x] < bds.min[kd_x])
      bds.min[kd_x] = pt[kd_x];
    if (pt[kd_y] < bds.min[kd_y])
      bds.min[kd_y] = pt[kd_y];
    if (pt[kd_z] < bds.min[kd_z])
      bds.min[kd_z] = pt[kd_z];

    if (pt[kd_x] > bds.max[kd_x])
      bds.max[kd_x] = pt[kd_x];
    if (pt[kd_y] > bds.max[kd_y])
      bds.max[kd_y] = pt[kd_y];
    if (pt[kd_z] > bds.max[kd_z])
      bds.max[kd_z] = pt[kd_z];
  }

  return bds;
}